

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

ImplicitCallFlags __thiscall Loop::GetImplicitCallFlags(Loop *this)

{
  ImplicitCallFlags IVar1;
  Loop *this_local;
  
  if (this->implicitCallFlags == ImplicitCall_HasNoInfo) {
    if (this->parent == (Loop *)0x0) {
      this->implicitCallFlags = ImplicitCall_None;
    }
    else {
      IVar1 = GetImplicitCallFlags(this->parent);
      this->implicitCallFlags = IVar1;
    }
  }
  return this->implicitCallFlags;
}

Assistant:

Js::ImplicitCallFlags
Loop::GetImplicitCallFlags()
{
    if (this->implicitCallFlags == Js::ImplicitCall_HasNoInfo)
    {
        if (this->parent == nullptr)
        {
            // We don't have any information, and we don't have any parent, so just assume that there aren't any implicit calls
            this->implicitCallFlags = Js::ImplicitCall_None;
        }
        else
        {
            // We don't have any information, get it from the parent and hope for the best
            this->implicitCallFlags = this->parent->GetImplicitCallFlags();
        }
    }
    return this->implicitCallFlags;
}